

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetClauseNum(Abc_Ntk_t *pNtk)

{
  DdManager *dd;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  DdNode *n;
  DdNode *pDVar4;
  int i;
  int iVar5;
  DdNode *zCover;
  DdNode *local_40;
  Abc_Ntk_t *local_38;
  
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    dd = (DdManager *)pNtk->pManFunc;
    iVar5 = 0;
    i = 0;
    local_38 = pNtk;
    do {
      if (pNtk->vObjs->nSize <= i) {
        return iVar5;
      }
      pAVar3 = Abc_NtkObj(pNtk,i);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        pDVar4 = (DdNode *)(pAVar3->field_5).pData;
        if (pDVar4 == (DdNode *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                        ,0x139,"int Abc_NtkGetClauseNum(Abc_Ntk_t *)");
        }
        n = Cudd_zddIsop(dd,pDVar4,pDVar4,&local_40);
        Cudd_Ref(n);
        Cudd_Ref(local_40);
        iVar1 = Abc_CountZddCubes(dd,local_40);
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDerefZdd(dd,local_40);
        pDVar4 = Cudd_zddIsop(dd,(DdNode *)((ulong)pDVar4 ^ 1),(DdNode *)((ulong)pDVar4 ^ 1),
                              &local_40);
        Cudd_Ref(pDVar4);
        Cudd_Ref(local_40);
        iVar2 = Abc_CountZddCubes(dd,local_40);
        iVar5 = iVar2 + iVar1 + iVar5;
        Cudd_RecursiveDeref(dd,pDVar4);
        Cudd_RecursiveDerefZdd(dd,local_40);
        pNtk = local_38;
      }
      i = i + 1;
    } while( true );
  }
  __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                ,0x136,"int Abc_NtkGetClauseNum(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkGetClauseNum( Abc_Ntk_t * pNtk )
{
    int nClauses = 0;
#ifdef ABC_USE_CUDD
    extern int Abc_CountZddCubes( DdManager * dd, DdNode * zCover );
    Abc_Obj_t * pNode;
    DdNode * bCover, * zCover, * bFunc;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    int i;
    assert( Abc_NtkIsBddLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        bFunc = (DdNode *)pNode->pData;

        bCover = Cudd_zddIsop( dd, bFunc, bFunc, &zCover );  
        Cudd_Ref( bCover );
        Cudd_Ref( zCover );
        nClauses += Abc_CountZddCubes( dd, zCover );
        Cudd_RecursiveDeref( dd, bCover );
        Cudd_RecursiveDerefZdd( dd, zCover );

        bCover = Cudd_zddIsop( dd, Cudd_Not(bFunc), Cudd_Not(bFunc), &zCover );  
        Cudd_Ref( bCover );
        Cudd_Ref( zCover );
        nClauses += Abc_CountZddCubes( dd, zCover );
        Cudd_RecursiveDeref( dd, bCover );
        Cudd_RecursiveDerefZdd( dd, zCover );
    }
#endif
    return nClauses;
}